

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printSourceInfo(AssertionPrinter *this)

{
  ostream *poVar1;
  Colour colourGuard;
  undefined4 in_stack_ffffffffffffff98;
  Code in_stack_ffffffffffffff9c;
  ostream *in_stack_ffffffffffffffa0;
  
  Colour::Colour((Colour *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  AssertionResult::getSourceInfo
            ((AssertionResult *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  poVar1 = Catch::operator<<(in_stack_ffffffffffffffa0,
                             (SourceLineInfo *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::operator<<(poVar1,": ");
  SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x275032);
  Colour::~Colour((Colour *)0x27503c);
  return;
}

Assistant:

void printSourceInfo() const {
                Colour colourGuard( Colour::FileName );
                stream << result.getSourceInfo() << ": ";
            }